

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

char * __thiscall btCollisionWorldImporter::duplicateName(btCollisionWorldImporter *this,char *name)

{
  int iVar1;
  size_t sVar2;
  char *in_RSI;
  ulong uVar3;
  char *newName;
  int l;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char **)0x0;
  }
  else {
    sVar2 = strlen(in_RSI);
    iVar1 = (int)sVar2;
    uVar3 = (ulong)(iVar1 + 1);
    if ((long)uVar3 < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    local_8 = (char **)operator_new__(uVar3);
    memcpy(local_8,in_RSI,(long)iVar1);
    *(undefined1 *)((long)local_8 + (long)iVar1) = 0;
    btAlignedObjectArray<char_*>::push_back
              ((btAlignedObjectArray<char_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),local_8);
  }
  return (char *)local_8;
}

Assistant:

char* btCollisionWorldImporter::duplicateName(const char* name)
{
	if (name)
	{
		int l = (int)strlen(name);
		char* newName = new char[l+1];
		memcpy(newName,name,l);
		newName[l] = 0;
		m_allocatedNames.push_back(newName);
		return newName;
	}
	return 0;
}